

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3PendingTermsClear(Fts3Table *p)

{
  long lVar1;
  Fts3Hash *pH;
  long in_RDI;
  PendingList *pList;
  Fts3Hash *pHash;
  Fts3HashElem *pElem;
  int i;
  undefined8 local_18;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x1ec); local_c = local_c + 1) {
    lVar1 = *(long *)(in_RDI + 0x1f0) + (long)local_c * 0x28;
    pH = (Fts3Hash *)(lVar1 + 8);
    for (local_18 = *(undefined8 **)(lVar1 + 0x10); local_18 != (undefined8 *)0x0;
        local_18 = (undefined8 *)*local_18) {
      fts3PendingListDelete((PendingList *)0x25784a);
    }
    sqlite3Fts3HashClear(pH);
  }
  *(undefined4 *)(in_RDI + 0x1fc) = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3PendingTermsClear(Fts3Table *p){
  int i;
  for(i=0; i<p->nIndex; i++){
    Fts3HashElem *pElem;
    Fts3Hash *pHash = &p->aIndex[i].hPending;
    for(pElem=fts3HashFirst(pHash); pElem; pElem=fts3HashNext(pElem)){
      PendingList *pList = (PendingList *)fts3HashData(pElem);
      fts3PendingListDelete(pList);
    }
    fts3HashClear(pHash);
  }
  p->nPendingData = 0;
}